

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O2

XmlRpcValue * __thiscall XmlRpc::XmlRpcValue::operator=(XmlRpcValue *this,XmlRpcValue *rhs)

{
  Type TVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  tm *ptVar12;
  tm *ptVar13;
  
  if (this == rhs) {
    return this;
  }
  invalidate(this);
  TVar1 = rhs->_type;
  this->_type = TVar1;
  switch(TVar1) {
  case TypeBoolean:
    (this->_value).asBool = (rhs->_value).asBool;
    break;
  case TypeInt:
    (this->_value).asInt = (rhs->_value).asInt;
    break;
  case TypeDouble:
    this->_value = rhs->_value;
    break;
  case TypeString:
    ptVar13 = (tm *)operator_new(0x20);
    std::__cxx11::string::string((string *)ptVar13,(string *)(rhs->_value).asTime);
    goto LAB_00288ee3;
  case TypeDateTime:
    ptVar12 = (tm *)operator_new(0x38);
    ptVar13 = (rhs->_value).asTime;
    iVar3 = ptVar13->tm_min;
    iVar4 = ptVar13->tm_hour;
    iVar5 = ptVar13->tm_mday;
    iVar6 = ptVar13->tm_mon;
    iVar7 = ptVar13->tm_year;
    iVar8 = ptVar13->tm_wday;
    iVar9 = ptVar13->tm_yday;
    iVar10 = ptVar13->tm_isdst;
    uVar11 = *(undefined4 *)&ptVar13->field_0x24;
    lVar2 = ptVar13->tm_gmtoff;
    ptVar12->tm_sec = ptVar13->tm_sec;
    ptVar12->tm_min = iVar3;
    ptVar12->tm_hour = iVar4;
    ptVar12->tm_mday = iVar5;
    ptVar12->tm_mon = iVar6;
    ptVar12->tm_year = iVar7;
    ptVar12->tm_wday = iVar8;
    ptVar12->tm_yday = iVar9;
    ptVar12->tm_isdst = iVar10;
    *(undefined4 *)&ptVar12->field_0x24 = uVar11;
    ptVar12->tm_gmtoff = lVar2;
    ptVar12->tm_zone = ptVar13->tm_zone;
    (this->_value).asTime = ptVar12;
    break;
  case TypeBase64:
    ptVar13 = (tm *)operator_new(0x18);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)ptVar13,
               (vector<char,_std::allocator<char>_> *)(rhs->_value).asTime);
    goto LAB_00288ee3;
  case TypeArray:
    ptVar13 = (tm *)operator_new(0x18);
    std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::vector
              ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)ptVar13,
               (vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
               (rhs->_value).asTime);
    goto LAB_00288ee3;
  case TypeStruct:
    ptVar13 = (tm *)operator_new(0x30);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                *)ptVar13,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                *)(rhs->_value).asTime);
LAB_00288ee3:
    (this->_value).asTime = ptVar13;
    break;
  default:
    (this->_value).asDouble = 0.0;
  }
  return this;
}

Assistant:

XmlRpcValue& XmlRpcValue::operator=(XmlRpcValue const& rhs)
  {
    if (this != &rhs)
    {
      invalidate();
      _type = rhs._type;
      switch (_type) {
        case TypeBoolean:  _value.asBool = rhs._value.asBool; break;
        case TypeInt:      _value.asInt = rhs._value.asInt; break;
        case TypeDouble:   _value.asDouble = rhs._value.asDouble; break;
        case TypeDateTime: _value.asTime = new struct tm(*rhs._value.asTime); break;
        case TypeString:   _value.asString = new std::string(*rhs._value.asString); break;
        case TypeBase64:   _value.asBinary = new BinaryData(*rhs._value.asBinary); break;
        case TypeArray:    _value.asArray = new ValueArray(*rhs._value.asArray); break;
        case TypeStruct:   _value.asStruct = new ValueStruct(*rhs._value.asStruct); break;
        default:           _value.asBinary = 0; break;
      }
    }
    return *this;
  }